

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

Promise<void> __thiscall
kj::Promise<void>::attach<kj::Own<capnp::CallContextHook>>
          (Promise<void> *this,Own<capnp::CallContextHook> *attachments)

{
  Own<kj::_::PromiseNode> *params;
  Own<capnp::CallContextHook> *params_00;
  NoInfer<kj::Own<capnp::CallContextHook>_> *in_RDX;
  PromiseNode *extraout_RDX;
  Promise<void> PVar1;
  Own<capnp::CallContextHook> local_50;
  Own<kj::_::AttachmentPromiseNode<kj::Own<capnp::CallContextHook>_>_> local_40;
  Own<kj::_::PromiseNode> local_30;
  NoInfer<kj::Own<capnp::CallContextHook>_> *local_20;
  Own<capnp::CallContextHook> *attachments_local;
  Promise<void> *this_local;
  
  local_20 = in_RDX;
  attachments_local = attachments;
  this_local = this;
  params = mv<kj::Own<kj::_::PromiseNode>>((Own<kj::_::PromiseNode> *)attachments);
  params_00 = fwd<kj::Own<capnp::CallContextHook>>(local_20);
  tuple<kj::Own<capnp::CallContextHook>>((kj *)&local_50,params_00);
  heap<kj::_::AttachmentPromiseNode<kj::Own<capnp::CallContextHook>>,kj::Own<kj::_::PromiseNode>,kj::Own<capnp::CallContextHook>>
            ((kj *)&local_40,params,&local_50);
  Own<kj::_::PromiseNode>::Own<kj::_::AttachmentPromiseNode<kj::Own<capnp::CallContextHook>>,void>
            (&local_30,&local_40);
  Promise(this,false,&local_30);
  Own<kj::_::PromiseNode>::~Own(&local_30);
  Own<kj::_::AttachmentPromiseNode<kj::Own<capnp::CallContextHook>_>_>::~Own(&local_40);
  Own<capnp::CallContextHook>::~Own(&local_50);
  PVar1.super_PromiseBase.node.ptr = extraout_RDX;
  PVar1.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar1.super_PromiseBase.node;
}

Assistant:

Promise<T> Promise<T>::attach(Attachments&&... attachments) {
  return Promise(false, kj::heap<_::AttachmentPromiseNode<Tuple<Attachments...>>>(
      kj::mv(node), kj::tuple(kj::fwd<Attachments>(attachments)...)));
}